

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

XMLByte * __thiscall
xercesc_4_0::XMLFormatter::getCharRef
          (XMLFormatter *this,XMLSize_t *count,XMLByte **ref,XMLCh *stdRef)

{
  XMLTranscoder *pXVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t outBytes;
  XMLSize_t charsEaten;
  XMLCh *stdRef_local;
  XMLByte **ref_local;
  XMLSize_t *count_local;
  XMLFormatter *this_local;
  XMLByte *pXVar4;
  
  stdRef_local = (XMLCh *)ref;
  if (*ref == (XMLByte *)0x0) {
    pXVar1 = this->fXCoder;
    charsEaten = (XMLSize_t)stdRef;
    ref_local = (XMLByte **)count;
    count_local = (XMLSize_t *)this;
    XVar3 = XMLString::stringLen(stdRef);
    iVar2 = (*pXVar1->_vptr_XMLTranscoder[3])(pXVar1,stdRef,XVar3,this->fTmpBuf,0x4000,&outBytes,0);
    pXVar4 = (XMLByte *)CONCAT44(extraout_var,iVar2);
    this->fTmpBuf[(long)pXVar4] = '\0';
    (this->fTmpBuf + 1)[(long)pXVar4] = '\0';
    (this->fTmpBuf + 2)[(long)pXVar4] = '\0';
    (this->fTmpBuf + 3)[(long)pXVar4] = '\0';
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,pXVar4 + 4);
    *(ulong *)stdRef_local = CONCAT44(extraout_var_00,iVar2);
    memcpy(*(void **)stdRef_local,this->fTmpBuf,(size_t)(pXVar4 + 4));
    *ref_local = pXVar4;
  }
  return *(XMLByte **)stdRef_local;
}

Assistant:

const XMLByte* XMLFormatter::getCharRef(XMLSize_t     &count,
                                        XMLByte*      &ref,
                                        const XMLCh *  stdRef)
{
   if (!ref) {

       XMLSize_t charsEaten;
       const XMLSize_t outBytes =
           fXCoder->transcodeTo(stdRef, XMLString::stringLen(stdRef),
                                fTmpBuf, kTmpBufSize, charsEaten,
                                XMLTranscoder::UnRep_Throw);

       fTmpBuf[outBytes] = 0;
       fTmpBuf[outBytes + 1] = 0;
       fTmpBuf[outBytes + 2] = 0;
       fTmpBuf[outBytes + 3] = 0;

       ref = (XMLByte*) fMemoryManager->allocate
       (
           (outBytes + 4) * sizeof(XMLByte)
       );//new XMLByte[outBytes + 4];
       memcpy(ref, fTmpBuf, outBytes + 4);
       count = outBytes;
   }

   return ref;
}